

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

vector<unsigned_long,_true> *
duckdb::IEJoinUnion::ExtractColumn<unsigned_long>
          (vector<unsigned_long,_true> *__return_storage_ptr__,SortedTable *table,idx_t col_idx)

{
  idx_t iVar1;
  reference this;
  pointer pSVar2;
  type sorted_data;
  Allocator *allocator;
  reference pvVar3;
  PayloadScanner scanner;
  DataChunk payload;
  PayloadScanner local_80;
  DataChunk local_68;
  
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__,
             (table->count).super___atomic_base<unsigned_long>._M_i);
  this = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
         ::get<true>(&(table->global_sort_state).sorted_blocks,0);
  pSVar2 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
           operator->(this);
  sorted_data = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                operator*(&pSVar2->payload_data);
  PayloadScanner::PayloadScanner(&local_80,sorted_data,&table->global_sort_state,false);
  DataChunk::DataChunk(&local_68);
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize(&local_68,allocator,&(table->global_sort_state).payload_layout.types,0x800);
  while( true ) {
    DataChunk::Reset(&local_68);
    PayloadScanner::Scan(&local_80,&local_68);
    iVar1 = local_68.count;
    if (local_68.count == 0) break;
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&local_68.data,col_idx);
    ::std::vector<unsigned_long,std::allocator<unsigned_long>>::insert<unsigned_long*,void>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
               .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(unsigned_long *)pvVar3->data,
               (unsigned_long *)((long)pvVar3->data + iVar1 * 8));
  }
  DataChunk::~DataChunk(&local_68);
  PayloadScanner::~PayloadScanner(&local_80);
  return __return_storage_ptr__;
}

Assistant:

static vector<T> ExtractColumn(SortedTable &table, idx_t col_idx) {
		vector<T> result;
		result.reserve(table.count);

		auto &gstate = table.global_sort_state;
		auto &blocks = *gstate.sorted_blocks[0]->payload_data;
		PayloadScanner scanner(blocks, gstate, false);

		DataChunk payload;
		payload.Initialize(Allocator::DefaultAllocator(), gstate.payload_layout.GetTypes());
		for (;;) {
			payload.Reset();
			scanner.Scan(payload);
			const auto count = payload.size();
			if (!count) {
				break;
			}

			const auto data_ptr = FlatVector::GetData<T>(payload.data[col_idx]);
			result.insert(result.end(), data_ptr, data_ptr + count);
		}

		return result;
	}